

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StandardShapes.cpp
# Opt level: O0

uint Assimp::StandardShapes::MakeOctahedron
               (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions)

{
  size_type sVar1;
  undefined1 local_58 [8];
  aiVector3D v5;
  aiVector3D v4;
  aiVector3D v3;
  aiVector3D v2;
  aiVector3D v1;
  aiVector3D v0;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *positions_local;
  
  sVar1 = std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::size(positions);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::reserve
            (positions,sVar1 + 0x18);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&v1.y,1.0,0.0,0.0);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&v2.y,-1.0,0.0,0.0);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&v3.y,0.0,1.0,0.0);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&v4.y,0.0,-1.0,0.0);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)&v5.y,0.0,0.0,1.0);
  aiVector3t<float>::aiVector3t((aiVector3t<float> *)local_58,0.0,0.0,-1.0);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v5.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v1.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v3.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v5.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v3.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v2.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v5.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v2.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v4.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v5.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v4.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v1.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_58);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v3.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v1.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_58);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v2.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v3.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_58);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v4.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v2.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)local_58);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v1.y);
  std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::push_back
            (positions,(value_type *)&v4.y);
  return 3;
}

Assistant:

unsigned int StandardShapes::MakeOctahedron(std::vector<aiVector3D>& positions)
{
    positions.reserve(positions.size()+24);

    const aiVector3D v0  = aiVector3D(1.0, 0.0, 0.0) ;
    const aiVector3D v1  = aiVector3D(-1.0, 0.0, 0.0);
    const aiVector3D v2  = aiVector3D(0.0, 1.0, 0.0);
    const aiVector3D v3  = aiVector3D(0.0, -1.0, 0.0);
    const aiVector3D v4  = aiVector3D(0.0, 0.0, 1.0);
    const aiVector3D v5  = aiVector3D(0.0, 0.0, -1.0);

    ADD_TRIANGLE(v4,v0,v2);
    ADD_TRIANGLE(v4,v2,v1);
    ADD_TRIANGLE(v4,v1,v3);
    ADD_TRIANGLE(v4,v3,v0);

    ADD_TRIANGLE(v5,v2,v0);
    ADD_TRIANGLE(v5,v1,v2);
    ADD_TRIANGLE(v5,v3,v1);
    ADD_TRIANGLE(v5,v0,v3);
    return 3;
}